

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grisu3.hpp
# Opt level: O0

bool jsoncons::detail::grisu3(double v,char *buffer,int *length,int *K)

{
  diy_fp_t W_00;
  diy_fp_t Wm_00;
  bool bVar1;
  int k;
  char *buffer_00;
  uint64_t uVar2;
  uint64_t uVar3;
  int iVar4;
  int *in_RDX;
  int iVar5;
  int iVar6;
  int *in_RSI;
  long in_RDI;
  diy_fp_t dVar7;
  diy_fp_t in;
  diy_fp_t y;
  diy_fp_t y_00;
  diy_fp_t y_01;
  diy_fp_t x;
  diy_fp_t x_00;
  diy_fp_t x_01;
  bool result;
  diy_fp_t Wm;
  diy_fp_t Wp;
  diy_fp_t W;
  diy_fp_t c_mk;
  int mk;
  diy_fp_t w;
  int gamma;
  int alpha;
  int q;
  diy_fp_t w_p;
  diy_fp_t w_m;
  undefined8 in_stack_fffffffffffffea8;
  double in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  diy_fp_t *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  undefined4 in_stack_ffffffffffffff74;
  undefined4 in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff88;
  int iVar8;
  undefined4 in_stack_ffffffffffffffac;
  undefined4 uVar9;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 uVar10;
  undefined8 local_40;
  undefined4 local_38;
  undefined8 local_30;
  undefined4 local_28;
  
  uVar10 = 0xffffffc8;
  normalized_boundaries
            ((double)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
             in_stack_fffffffffffffef8,
             (diy_fp_t *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  dVar7 = double2diy_fp(in_stack_fffffffffffffeb0);
  in._8_8_ = dVar7._8_8_;
  in.f = (ulong)(uint)dVar7.e;
  dVar7 = normalize_diy_fp((detail *)dVar7.f,in);
  buffer_00 = (char *)dVar7.f;
  iVar4 = dVar7.e;
  k = k_comp((int)((ulong)in_stack_fffffffffffffeb0 >> 0x20),SUB84(in_stack_fffffffffffffeb0,0),
             (int)((ulong)in_stack_fffffffffffffea8 >> 0x20));
  dVar7 = cached_power(k);
  uVar2 = dVar7.f;
  iVar5 = dVar7.e;
  x.e = iVar4;
  x.f = (uint64_t)buffer_00;
  y._12_4_ = 0;
  y.f = SUB128(dVar7._0_12_,0);
  y.e = SUB124(dVar7._0_12_,8);
  x._12_4_ = 0;
  iVar8 = iVar4;
  uVar9 = in_stack_ffffffffffffffac;
  dVar7 = multiply(x,y);
  uVar3 = dVar7.f;
  iVar6 = dVar7.e;
  x_00.e = local_38;
  x_00.f = local_40;
  y_00.e = iVar5;
  y_00.f = uVar2;
  y_00._12_4_ = 0;
  x_00._12_4_ = 0;
  multiply(x_00,y_00);
  x_01.e = local_28;
  x_01.f = local_30;
  y_01.e = iVar5;
  y_01.f = uVar2;
  y_01._12_4_ = 0;
  x_01._12_4_ = 0;
  multiply(x_01,y_01);
  *in_RDX = -k;
  Wm_00.f._4_4_ = in_stack_ffffffffffffff84;
  Wm_00.f._0_4_ = iVar5;
  Wm_00.e = in_stack_ffffffffffffff88;
  Wm_00._12_4_ = k;
  W_00.f._4_4_ = in_stack_ffffffffffffff74;
  W_00.f._0_4_ = iVar6;
  W_00._8_8_ = uVar2;
  dVar7.f._4_4_ = in_stack_ffffffffffffffac;
  dVar7.f._0_4_ = iVar4;
  dVar7._8_8_ = uVar3;
  bVar1 = digit_gen(Wm_00,W_00,dVar7,buffer_00,(int *)CONCAT44(uVar9,iVar8),
                    (int *)CONCAT44(uVar10,in_stack_ffffffffffffffb0));
  *(undefined1 *)(in_RDI + *in_RSI) = 0;
  return bVar1;
}

Assistant:

inline
bool grisu3(double v, char *buffer, int *length, int *K)
{
    diy_fp_t w_m, w_p;
    int q = 64, alpha = -59, gamma = -56;
    normalized_boundaries(v, &w_m, &w_p);
    diy_fp_t w = normalize_diy_fp(double2diy_fp(v));
    int mk = k_comp(w_p.e + q, alpha, gamma);
    diy_fp_t c_mk = cached_power(mk);
    diy_fp_t W  = multiply(w,   c_mk);
    diy_fp_t Wp = multiply(w_p, c_mk);
    diy_fp_t Wm = multiply(w_m, c_mk);
    *K = -mk;
    bool result = digit_gen(Wm, W, Wp, buffer, length, K);
    buffer[*length] = 0;
    return result;
}